

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Ptr * __thiscall
wabt::interp::Instance::Instantiate
          (Ptr *__return_storage_ptr__,Instance *this,Store *store,Ref module,RefVec *imports,
          Ptr *out_trap)

{
  u64 uVar1;
  bool bVar2;
  Result result_00;
  u32 uVar3;
  u32 uVar4;
  u32 uVar5;
  Module *pMVar6;
  ModuleDesc *pMVar7;
  value_type *pvVar8;
  const_reference pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Extern *pEVar12;
  Instance *pIVar13;
  pointer pEVar14;
  reference pGVar15;
  Features *this_00;
  reference this_01;
  ElemDesc *pEVar16;
  Table *pTVar17;
  ulong uVar18;
  reference this_02;
  DataDesc *pDVar19;
  reference pvVar20;
  Memory *pMVar21;
  MemoryType *pMVar22;
  u64 uVar23;
  u64 uVar24;
  Func *this_03;
  Value value_00;
  u64 local_988;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_880;
  Enum local_864;
  undefined1 local_860 [8];
  Values results;
  undefined1 local_840 [8];
  Ptr func;
  StartDesc *start;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> *__range2_8;
  string local_7f0;
  Ptr local_7d0;
  Enum local_7b8;
  Enum local_7b4;
  Enum local_7b0;
  Result local_7ac;
  u64 local_7a8;
  u64 offset_1;
  Enum local_794;
  FuncDesc local_790;
  Ref local_718;
  Ptr local_710;
  Ref local_6f8;
  Ref func_ref_2;
  Value offset_op;
  undefined1 local_6d8 [8];
  Ptr memory;
  Result result_1;
  DataDesc *desc_9;
  DataSegment *segment_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_> *__range3_1;
  string local_678;
  Ptr local_658;
  Enum local_63c;
  Enum local_638;
  Enum local_634;
  Result local_630;
  u32 local_62c;
  size_t sStack_628;
  u32 offset;
  Enum local_61c;
  FuncDesc local_618;
  Ref local_5a0;
  Ptr local_598;
  Ref local_580;
  Ref func_ref_1;
  Value value_1;
  undefined1 local_560 [8];
  Ptr table;
  Result result;
  ElemDesc *desc_8;
  ElemSegment *segment;
  iterator __end3;
  iterator __begin3;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *__range3;
  reference pDStack_510;
  int pass;
  reference local_508;
  DataDesc *desc_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *__range2_7;
  reference local_4e0;
  ElemDesc *desc_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *__range2_6;
  Ref ref;
  ExportDesc *desc_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range2_5;
  Ptr local_470;
  value_type local_458;
  TagType *local_450;
  TagDesc *desc_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> *__range2_4;
  undefined1 local_420 [48];
  value_type local_3f0;
  size_t local_3e8;
  Enum local_3dc;
  FuncDesc local_3d8;
  Ref local_360;
  Ptr local_358;
  Ref local_340;
  Ref func_ref;
  Value value;
  GlobalDesc *desc_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> *__range2_3;
  Ptr local_2e0;
  value_type local_2c8;
  MemoryType *local_2c0;
  MemoryDesc *desc_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> *__range2_2;
  Ptr local_270;
  value_type local_258;
  TableType *local_250;
  TableDesc *desc_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *__range2_1;
  Ref local_1b8;
  Ptr local_1b0;
  value_type local_198;
  reference local_190;
  FuncDesc *desc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *__range2;
  undefined1 local_160 [8];
  Ptr extern_;
  string local_130;
  Ptr local_110;
  size_t local_f8;
  size_t local_f0;
  Ref local_e8;
  Ref extern_ref;
  value_type *import_desc;
  size_t i;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_c8;
  allocator<char> local_a9;
  string local_a8;
  Ptr local_88;
  value_type *local_70;
  size_t import_desc_count;
  Ptr inst;
  undefined1 local_48 [8];
  Ptr mod;
  Ptr *out_trap_local;
  RefVec *imports_local;
  Store *store_local;
  Ref module_local;
  
  inst.root_index_ = (Index)store;
  mod.root_index_ = (Index)imports;
  store_local = store;
  module_local.index = (size_t)__return_storage_ptr__;
  RefPtr<wabt::interp::Module>::RefPtr
            ((RefPtr<wabt::interp::Module> *)local_48,(Store *)this,(Ref)store);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            ((RefPtr<wabt::interp::Instance> *)&import_desc_count,(Store *)this,(Store *)this,
             (Ref *)&store_local);
  pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
  pMVar7 = Module::desc(pMVar6);
  local_70 = (value_type *)
             std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::size
                       (&pMVar7->imports);
  pvVar8 = (value_type *)
           std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                     ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)module.index)
  ;
  if (pvVar8 < local_70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"not enough imports!",&local_a9);
    memset(&local_c8,0,0x18);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_c8);
    Trap::New(&local_88,(Store *)this,&local_a8,&local_c8);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_88);
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
  }
  else {
    for (import_desc = (value_type *)0x0; import_desc < local_70;
        import_desc = (value_type *)&(import_desc->type).module.field_0x1) {
      pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
      pMVar7 = Module::desc(pMVar6);
      extern_ref.index =
           (size_t)std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ::operator[](&pMVar7->imports,(size_type)import_desc);
      pvVar9 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                         ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)
                          module.index,(size_type)import_desc);
      local_f0 = pvVar9->index;
      local_f8 = Ref::Null.index;
      local_e8.index = local_f0;
      bVar2 = interp::operator==((Ref)local_f0,Ref::Null);
      if (bVar2) {
        uVar10 = std::__cxx11::string::c_str();
        uVar11 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_(&local_130,"invalid import \"%s.%s\"",uVar10,uVar11);
        memset(&extern_.root_index_,0,0x18);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        Trap::New(&local_110,(Store *)this,&local_130,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                  &extern_.root_index_);
        RefPtr<wabt::interp::Trap>::operator=
                  ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_110);
        RefPtr<wabt::interp::Trap>::~RefPtr(&local_110);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        std::__cxx11::string::~string((string *)&local_130);
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_001720d6;
      }
      RefPtr<wabt::interp::Extern>::RefPtr
                ((RefPtr<wabt::interp::Extern> *)local_160,(Store *)this,local_e8);
      pEVar12 = RefPtr<wabt::interp::Extern>::operator->((RefPtr<wabt::interp::Extern> *)local_160);
      result_00.enum_ =
           (*(pEVar12->super_Object)._vptr_Object[3])(pEVar12,this,extern_ref.index,mod.root_index_)
      ;
      bVar2 = Failed(result_00);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        bVar2 = true;
      }
      else {
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                  (&pIVar13->imports_,&local_e8);
        pEVar14 = std::
                  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  ::operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                *)(extern_ref.index + 0x40));
        switch(pEVar14->kind) {
        case First:
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar13->funcs_,&local_e8);
          break;
        case Table:
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar13->tables_,&local_e8);
          break;
        case Memory:
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar13->memories_,&local_e8);
          break;
        case Global:
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar13->globals_,&local_e8);
          break;
        case Last:
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar13->tags_,&local_e8);
        }
        bVar2 = false;
      }
      RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_160);
      if (bVar2) goto LAB_001720d6;
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::begin
                       (&pMVar7->funcs);
    desc = (FuncDesc *)
           std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::end
                     (&pMVar7->funcs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                                       *)&desc), bVar2) {
      local_190 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                  ::operator*(&__end2);
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_1b8 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc((FuncDesc *)&__range2_1,local_190);
      DefinedFunc::New(&local_1b0,(Store *)this,local_1b8,(FuncDesc *)&__range2_1);
      local_198.index = (size_t)RefPtr<wabt::interp::DefinedFunc>::ref(&local_1b0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->funcs_,&local_198);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1b0);
      FuncDesc::~FuncDesc((FuncDesc *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
      ::operator++(&__end2);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_1 = std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::begin
                         (&pMVar7->tables);
    desc_1 = (TableDesc *)
             std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::end
                       (&pMVar7->tables);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                               *)&desc_1), bVar2) {
      local_250 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                   ::operator*(&__end2_1)->type;
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TableType::TableType((TableType *)&__range2_2,local_250);
      Table::New(&local_270,(Store *)this,(TableType *)&__range2_2);
      local_258.index = (size_t)RefPtr<wabt::interp::Table>::ref(&local_270);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->tables_,&local_258);
      RefPtr<wabt::interp::Table>::~RefPtr(&local_270);
      TableType::~TableType((TableType *)&__range2_2);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
      ::operator++(&__end2_1);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_2 = std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
               begin(&pMVar7->memories);
    desc_2 = (MemoryDesc *)
             std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::end
                       (&pMVar7->memories);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                               *)&desc_2), bVar2) {
      local_2c0 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                   ::operator*(&__end2_2)->type;
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      MemoryType::MemoryType((MemoryType *)&__range2_3,local_2c0);
      Memory::New(&local_2e0,(Store *)this,(MemoryType *)&__range2_3);
      local_2c8.index = (size_t)RefPtr<wabt::interp::Memory>::ref(&local_2e0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->memories_,&local_2c8);
      RefPtr<wabt::interp::Memory>::~RefPtr(&local_2e0);
      MemoryType::~MemoryType((MemoryType *)&__range2_3);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
      ::operator++(&__end2_2);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_3 = std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
               begin(&pMVar7->globals);
    desc_3 = (GlobalDesc *)
             std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::end
                       (&pMVar7->globals);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                               *)&desc_3), bVar2) {
      pGVar15 = __gnu_cxx::
                __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                ::operator*(&__end2_3);
      Value::Value((Value *)&func_ref);
      local_360 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc(&local_3d8,&pGVar15->init_func);
      DefinedFunc::New(&local_358,(Store *)this,local_360,&local_3d8);
      local_340 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_358);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_358);
      FuncDesc::~FuncDesc(&local_3d8);
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_3e8 = local_340.index;
      local_3dc = (Enum)CallInitFunc(pIVar13,(Store *)this,local_340,(Value *)&func_ref,
                                     (Ptr *)mod.root_index_);
      bVar2 = Failed((Result)local_3dc);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_001720d6;
      }
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      GlobalType::GlobalType((GlobalType *)local_420,&pGVar15->type);
      value_00.field_0._8_8_ = out_trap;
      value_00.field_0.i64_ = value.field_0.i64_;
      Global::New((Ptr *)(local_420 + 0x18),(Global *)this,(Store *)local_420,
                  (GlobalType *)func_ref.index,value_00);
      local_3f0.index =
           (size_t)RefPtr<wabt::interp::Global>::ref
                             ((RefPtr<wabt::interp::Global> *)(local_420 + 0x18));
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->globals_,&local_3f0);
      RefPtr<wabt::interp::Global>::~RefPtr((RefPtr<wabt::interp::Global> *)(local_420 + 0x18));
      GlobalType::~GlobalType((GlobalType *)local_420);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
      ::operator++(&__end2_3);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_4 = std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::begin
                         (&pMVar7->tags);
    desc_4 = (TagDesc *)
             std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::end
                       (&pMVar7->tags);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
                               *)&desc_4), bVar2) {
      local_450 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
                   ::operator*(&__end2_4)->type;
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TagType::TagType((TagType *)&__range2_5,local_450);
      Tag::New(&local_470,(Store *)this,(TagType *)&__range2_5);
      local_458.index = (size_t)RefPtr<wabt::interp::Tag>::ref(&local_470);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->tags_,&local_458);
      RefPtr<wabt::interp::Tag>::~RefPtr(&local_470);
      TagType::~TagType((TagType *)&__range2_5);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
      ::operator++(&__end2_4);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_5 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
               begin(&pMVar7->exports);
    desc_5 = (ExportDesc *)
             std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                       (&pMVar7->exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                               *)&desc_5), bVar2) {
      ref.index = (size_t)__gnu_cxx::
                          __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                          ::operator*(&__end2_5);
      pEVar14 = std::
                unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ::operator->(&(((reference)ref.index)->type).type);
      switch(pEVar14->kind) {
      case First:
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar13->funcs_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar20->index;
        break;
      case Table:
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar13->tables_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar20->index;
        break;
      case Memory:
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar13->memories_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar20->index;
        break;
      case Global:
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar13->globals_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar20->index;
        break;
      case Last:
        pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar13->tags_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar20->index;
      }
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar13->exports_,(value_type *)&__range2_6);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
      ::operator++(&__end2_5);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_6 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::begin
                         (&pMVar7->elems);
    desc_6 = (ElemDesc *)
             std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::end
                       (&pMVar7->elems);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                               *)&desc_6), bVar2) {
      local_4e0 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                  ::operator*(&__end2_6);
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __range2_7 = (vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *)
                   local_4e0;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &pIVar13->elems_,(ElemDesc **)&__range2_7,
                 (RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
      ::operator++(&__end2_6);
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_7 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::begin
                         (&pMVar7->datas);
    desc_7 = (DataDesc *)
             std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::end
                       (&pMVar7->datas);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                               *)&desc_7), bVar2) {
      local_508 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                  ::operator*(&__end2_7);
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pDStack_510 = local_508;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &pIVar13->datas_,&stack0xfffffffffffffaf0);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
      ::operator++(&__end2_7);
    }
    this_00 = Store::features((Store *)this);
    bVar2 = Features::bulk_memory_enabled(this_00);
    for (__range3._4_4_ = (uint)bVar2; (int)__range3._4_4_ < 2; __range3._4_4_ = __range3._4_4_ + 1)
    {
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3 = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
               begin(&pIVar13->elems_);
      segment = (ElemSegment *)
                std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
                end(&pIVar13->elems_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                                         *)&segment), bVar2) {
        this_01 = __gnu_cxx::
                  __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                  ::operator*(&__end3);
        pEVar16 = ElemSegment::desc(this_01);
        if (pEVar16->mode == Active) {
          Result::Result((Result *)((long)&table.root_index_ + 4));
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar13->tables_,(ulong)pEVar16->table_index);
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)local_560,(Store *)this,(Ref)pvVar20->index);
          Value::Value((Value *)&func_ref_1);
          local_5a0 = RefPtr<wabt::interp::Instance>::ref
                                ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          FuncDesc::FuncDesc(&local_618,&pEVar16->init_func);
          DefinedFunc::New(&local_598,(Store *)this,local_5a0,&local_618);
          local_580 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_598);
          RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_598);
          FuncDesc::~FuncDesc(&local_618);
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          sStack_628 = local_580.index;
          local_61c = (Enum)CallInitFunc(pIVar13,(Store *)this,local_580,(Value *)&func_ref_1,
                                         (Ptr *)mod.root_index_);
          bVar2 = Failed((Result)local_61c);
          if (bVar2) {
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
            bVar2 = true;
          }
          else {
            local_62c = Value::Get<unsigned_int>((Value *)&func_ref_1);
            if (__range3._4_4_ == 0) {
              pTVar17 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_560);
              uVar5 = local_62c;
              uVar3 = ElemSegment::size(this_01);
              bVar2 = Table::IsValidRange(pTVar17,uVar5,uVar3);
              Result::Result(&local_630,(uint)!bVar2);
              table.root_index_._4_4_ = local_630.enum_;
            }
            else {
              pTVar17 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_560);
              uVar5 = local_62c;
              uVar3 = ElemSegment::size(this_01);
              local_638 = (Enum)Table::Init(pTVar17,(Store *)this,uVar5,this_01,0,uVar3);
              local_634 = local_638;
              table.root_index_._4_4_ = (Result)local_638;
              bVar2 = Succeeded((Result)local_638);
              if (bVar2) {
                ElemSegment::Drop(this_01);
              }
            }
            local_63c = table.root_index_._4_4_;
            bVar2 = Failed(table.root_index_._4_4_);
            uVar5 = local_62c;
            if (bVar2) {
              uVar18 = (ulong)local_62c;
              uVar3 = ElemSegment::size(this_01);
              pTVar17 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_560);
              uVar4 = Table::size(pTVar17);
              StringPrintf_abi_cxx11_
                        (&local_678,
                         "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                         ,(ulong)uVar5,uVar18 + uVar3,(ulong)uVar4);
              memset(&__range3_1,0,0x18);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range3_1);
              Trap::New(&local_658,(Store *)this,&local_678,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &__range3_1);
              RefPtr<wabt::interp::Trap>::operator=
                        ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_658);
              RefPtr<wabt::interp::Trap>::~RefPtr(&local_658);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range3_1);
              std::__cxx11::string::~string((string *)&local_678);
              RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
          RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_560);
          if (bVar2) goto LAB_001720d6;
        }
        else if (pEVar16->mode == Declared) {
          ElemSegment::Drop(this_01);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
        ::operator++(&__end3);
      }
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3_1 = std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                 ::begin(&pIVar13->datas_);
      segment_1 = (DataSegment *)
                  std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                  ::end(&pIVar13->datas_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                                 *)&segment_1), bVar2) {
        this_02 = __gnu_cxx::
                  __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                  ::operator*(&__end3_1);
        pDVar19 = DataSegment::desc(this_02);
        if (pDVar19->mode == Active) {
          Result::Result((Result *)((long)&memory.root_index_ + 4));
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar13->memories_,(ulong)pDVar19->memory_index);
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)local_6d8,(Store *)this,(Ref)pvVar20->index);
          Value::Value((Value *)&func_ref_2);
          local_718 = RefPtr<wabt::interp::Instance>::ref
                                ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          FuncDesc::FuncDesc(&local_790,&pDVar19->init_func);
          DefinedFunc::New(&local_710,(Store *)this,local_718,&local_790);
          local_6f8 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_710);
          RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_710);
          FuncDesc::~FuncDesc(&local_790);
          pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          offset_1 = local_6f8.index;
          local_794 = (Enum)CallInitFunc(pIVar13,(Store *)this,local_6f8,(Value *)&func_ref_2,
                                         (Ptr *)mod.root_index_);
          bVar2 = Failed((Result)local_794);
          if (bVar2) {
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
            bVar2 = true;
          }
          else {
            pMVar21 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_6d8);
            pMVar22 = Memory::type(pMVar21);
            if (((pMVar22->limits).is_64 & 1U) == 0) {
              uVar5 = Value::Get<unsigned_int>((Value *)&func_ref_2);
              local_988 = (u64)uVar5;
            }
            else {
              local_988 = Value::Get<unsigned_long>((Value *)&func_ref_2);
            }
            local_7a8 = local_988;
            if (__range3._4_4_ == 0) {
              pMVar21 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6d8);
              uVar1 = local_7a8;
              uVar23 = DataSegment::size(this_02);
              bVar2 = Memory::IsValidAccess(pMVar21,uVar1,0,uVar23);
              Result::Result(&local_7ac,(uint)!bVar2);
              memory.root_index_._4_4_ = local_7ac.enum_;
            }
            else {
              pMVar21 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6d8);
              uVar1 = local_7a8;
              uVar23 = DataSegment::size(this_02);
              local_7b4 = (Enum)Memory::Init(pMVar21,uVar1,this_02,0,uVar23);
              local_7b0 = local_7b4;
              memory.root_index_._4_4_ = (Result)local_7b4;
              bVar2 = Succeeded((Result)local_7b4);
              if (bVar2) {
                DataSegment::Drop(this_02);
              }
            }
            local_7b8 = memory.root_index_._4_4_;
            bVar2 = Failed(memory.root_index_._4_4_);
            uVar1 = local_7a8;
            if (bVar2) {
              uVar23 = DataSegment::size(this_02);
              pMVar21 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6d8);
              uVar24 = Memory::ByteSize(pMVar21);
              StringPrintf_abi_cxx11_
                        (&local_7f0,
                         "out of bounds memory access: data segment is out of bounds: [%lu, %lu) >= max value %lu"
                         ,uVar1,uVar1 + uVar23,uVar24);
              memset(&__range2_8,0,0x18);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range2_8);
              Trap::New(&local_7d0,(Store *)this,&local_7f0,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &__range2_8);
              RefPtr<wabt::interp::Trap>::operator=
                        ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_7d0);
              RefPtr<wabt::interp::Trap>::~RefPtr(&local_7d0);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range2_8);
              std::__cxx11::string::~string((string *)&local_7f0);
              RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
          RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_6d8);
          if (bVar2) goto LAB_001720d6;
        }
        else if (pDVar19->mode == Declared) {
          DataSegment::Drop(this_02);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
        ::operator++(&__end3_1);
      }
    }
    pMVar6 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar7 = Module::desc(pMVar6);
    __end2_8 = std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::begin
                         (&pMVar7->starts);
    start = (StartDesc *)
            std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::end
                      (&pMVar7->starts);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_8,
                              (__normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                               *)&start), bVar2) {
      func.root_index_ =
           (Index)__gnu_cxx::
                  __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                  ::operator*(&__end2_8);
      pIVar13 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pvVar20 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                          (&pIVar13->funcs_,(ulong)*(uint *)func.root_index_);
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar20->index;
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)local_840,(Store *)this,
                 (Ref)results.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_860);
      this_03 = RefPtr<wabt::interp::Func>::operator->((RefPtr<wabt::interp::Func> *)local_840);
      memset(&local_880,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_880);
      local_864 = (Enum)Func::Call(this_03,(Store *)this,&local_880,(Values *)local_860,
                                   (Ptr *)mod.root_index_,(Stream *)0x0);
      bVar2 = Failed((Result)local_864);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_880);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
      }
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_860);
      RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_840);
      if (bVar2) goto LAB_001720d6;
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
      ::operator++(&__end2_8);
    }
    RefPtr<wabt::interp::Instance>::RefPtr
              (__return_storage_ptr__,(RefPtr<wabt::interp::Instance> *)&import_desc_count);
  }
LAB_001720d6:
  RefPtr<wabt::interp::Instance>::~RefPtr((RefPtr<wabt::interp::Instance> *)&import_desc_count);
  RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Tag:    inst->tags_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
      return {};
    }
    inst->globals_.push_back(Global::New(store, desc.type, value).ref());
  }

  // Tags.
  for (auto&& desc : mod->desc().tags) {
    inst->tags_.push_back(Tag::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports) {
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Tag:    ref = inst->tags_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  // The MVP requires that all segments are bounds-checked before being copied
  // into the table or memory. The bulk memory proposal changes this behavior;
  // instead, each segment is copied in order. If any segment fails, then no
  // further segments are copied. Any data that was written persists.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        Value value;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
          return {};
        }
        u32 offset = value.Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        Value offset_op;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &offset_op, out_trap))) {
          return {};
        }
        u64 offset = memory->type().limits.is_64 ? offset_op.Get<u64>()
                                                 : offset_op.Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds memory access: data segment is "
                         "out of bounds: [%" PRIu64 ", %" PRIu64
                         ") >= max value %" PRIu64,
                         offset, offset + segment.size(), memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}